

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O2

int libssh2_channel_signal_ex(LIBSSH2_CHANNEL *channel,char *signame,size_t signame_len)

{
  LIBSSH2_SESSION *pLVar1;
  int iVar2;
  time_t start_time;
  uchar *puVar3;
  char *errmsg;
  uchar *local_40;
  char *local_38;
  
  if (channel == (LIBSSH2_CHANNEL *)0x0) {
    iVar2 = -0x27;
  }
  else {
    local_38 = signame;
    start_time = time((time_t *)0x0);
    do {
      pLVar1 = channel->session;
      if (channel->sendsignal_state == libssh2_NB_state_created) {
LAB_0010ca01:
        iVar2 = _libssh2_transport_send
                          (pLVar1,channel->sendsignal_packet,channel->sendsignal_packet_len,
                           (uchar *)0x0,0);
        if (iVar2 != -0x25) {
          if (iVar2 == 0) {
            (*pLVar1->free)(channel->sendsignal_packet,&pLVar1->abstract);
            iVar2 = 0;
LAB_0010cac8:
            channel->sendsignal_state = libssh2_NB_state_idle;
            return iVar2;
          }
          (*pLVar1->free)(channel->sendsignal_packet,&pLVar1->abstract);
          channel->sendsignal_state = libssh2_NB_state_idle;
          errmsg = "Unable to send signal packet";
          goto LAB_0010ca6f;
        }
        _libssh2_error(pLVar1,-0x25,"Would block sending signal request");
      }
      else {
        if (channel->sendsignal_state != libssh2_NB_state_idle) {
          iVar2 = -0xe;
          goto LAB_0010cac8;
        }
        channel->sendsignal_packet_len = signame_len + 0x14;
        puVar3 = (uchar *)(*pLVar1->alloc)(signame_len + 0x14,&pLVar1->abstract);
        channel->sendsignal_packet = puVar3;
        if (puVar3 != (uchar *)0x0) {
          local_40 = puVar3 + 1;
          *puVar3 = 'b';
          _libssh2_store_u32(&local_40,(channel->remote).id);
          _libssh2_store_str(&local_40,"signal",6);
          *local_40 = '\0';
          local_40 = local_40 + 1;
          _libssh2_store_str(&local_40,local_38,signame_len);
          channel->sendsignal_state = libssh2_NB_state_created;
          goto LAB_0010ca01;
        }
        iVar2 = -6;
        errmsg = "Unable to allocate memory for signal request";
LAB_0010ca6f:
        iVar2 = _libssh2_error(pLVar1,iVar2,errmsg);
        if (iVar2 != -0x25) {
          return iVar2;
        }
      }
      pLVar1 = channel->session;
      if ((pLVar1 == (LIBSSH2_SESSION *)0x0) || (pLVar1->api_block_mode == 0)) {
        return -0x25;
      }
      iVar2 = _libssh2_wait_socket(pLVar1,start_time);
    } while (iVar2 == 0);
  }
  return iVar2;
}

Assistant:

LIBSSH2_API int
libssh2_channel_signal_ex(LIBSSH2_CHANNEL *channel,
                          const char *signame,
                          size_t signame_len)
{
    int rc;

    if(!channel)
        return LIBSSH2_ERROR_BAD_USE;

    BLOCK_ADJUST(rc, channel->session,
                 channel_signal(channel, signame, signame_len));
    return rc;
}